

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  void *pvVar1;
  ParamDictPrivate *pPVar2;
  size_type sVar3;
  undefined1 auVar4 [4];
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  long *plVar10;
  int **ppiVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  float *ptr;
  float fVar16;
  int id;
  int len;
  char vstr [16];
  int v;
  char comma [4];
  char vstr_1 [16];
  undefined1 local_19c [4];
  int **local_198;
  iterator iStack_190;
  int *local_188;
  long lStack_180;
  char local_178 [24];
  long *local_160 [2];
  long local_150 [2];
  undefined1 local_13c [4];
  vector<float,_std::allocator<float>_> local_138 [10];
  char local_47;
  
  clear(this);
  local_19c = (undefined1  [4])0x0;
  iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d=");
  auVar4 = local_19c;
  do {
    if (iVar8 != 1) {
      return 0;
    }
    local_19c = auVar4;
    if ((int)auVar4 < -0x5b03) {
      local_19c = (undefined1  [4])(-(int)auVar4 - 0x5b04);
    }
    if ((int)local_19c < 0x20) {
      if ((int)auVar4 < -0x5b03) {
        local_198 = (int **)((ulong)local_198 & 0xffffffff00000000);
        iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_198);
        if (iVar8 != 1) {
          load_param();
          goto LAB_0014166c;
        }
        Mat::create(&this->d->params[(int)local_19c].v,(int)local_198,4,(Allocator *)0x0);
        bVar7 = false;
        if (0 < (int)local_198) {
          lVar14 = 0;
          lVar15 = 0;
          do {
            iVar8 = (*dr->_vptr_DataReader[2])(dr,",%15[^,\n ]",local_138);
            if (iVar8 != 1) {
              load_param();
LAB_0014175b:
              fputc(10,_stderr);
              bVar7 = true;
              break;
            }
            bVar6 = vstr_is_float((char *)local_138);
            pvVar1 = this->d->params[(int)local_19c].v.data;
            if (bVar6) {
              fVar16 = vstr_to_float((char *)local_138);
              *(float *)((long)pvVar1 + lVar14) = fVar16;
              iVar12 = 6;
            }
            else {
              iVar8 = __isoc99_sscanf(local_138,"%d",(long)pvVar1 + lVar14);
              iVar12 = 5;
              if (iVar8 != 1) {
                load_param();
                goto LAB_0014175b;
              }
            }
            this->d->params[(int)local_19c].type = iVar12;
            lVar15 = lVar15 + 1;
            lVar14 = lVar14 + 4;
          } while (lVar15 < (int)local_198);
        }
      }
      else {
        iVar8 = (*dr->_vptr_DataReader[2])(dr,"%15[^,\n ]",local_178);
        cVar5 = local_178[0];
        if (iVar8 != 1) {
          load_param();
          goto LAB_0014166c;
        }
        iVar12 = (int)local_178[0];
        iVar8 = isalpha(iVar12);
        if ((iVar12 == 0x22) || (iVar8 != 0)) {
          local_47 = '\0';
          pcVar13 = "%255[^\n ]";
          if (cVar5 == '\"') {
            pcVar13 = "%255[^\"\n]\"";
          }
          iVar8 = (*dr->_vptr_DataReader[2])(dr,pcVar13,local_138);
          if (iVar8 == 1) {
            if (local_47 != '\0') {
              load_param((ParamDict *)local_19c);
              goto LAB_0014166c;
            }
            if (local_178[0] == '\"') {
              local_160[0] = local_150;
              pcVar13 = local_178 + 1;
              sVar9 = strlen(pcVar13);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_160,pcVar13,pcVar13 + sVar9);
              plVar10 = (long *)std::__cxx11::string::append((char *)local_160);
            }
            else {
              local_160[0] = local_150;
              sVar9 = strlen(local_178);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_160,local_178,local_178 + sVar9);
              plVar10 = (long *)std::__cxx11::string::append((char *)local_160);
            }
            ppiVar11 = (int **)(plVar10 + 2);
            if ((int **)*plVar10 == ppiVar11) {
              local_188 = *ppiVar11;
              lStack_180 = plVar10[3];
              local_198 = &local_188;
            }
            else {
              local_188 = *ppiVar11;
              local_198 = (int **)*plVar10;
            }
            iStack_190._M_current = (int *)plVar10[1];
            *plVar10 = (long)ppiVar11;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::operator=
                      ((string *)&this->d->params[(int)local_19c].s,(string *)&local_198);
            if (local_198 != &local_188) {
              operator_delete(local_198,(long)local_188 + 1);
            }
            if (local_160[0] != local_150) {
              operator_delete(local_160[0],local_150[0] + 1);
            }
          }
          else {
            local_198 = &local_188;
            if (local_178[0] == '\"') {
              pcVar13 = local_178 + 1;
              sVar9 = strlen(pcVar13);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_198,pcVar13,pcVar13 + sVar9);
              std::__cxx11::string::operator=
                        ((string *)&this->d->params[(int)local_19c].s,(string *)&local_198);
              if (local_198 != &local_188) {
                operator_delete(local_198,(long)local_188 + 1);
              }
            }
            else {
              sVar9 = strlen(local_178);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_198,local_178,local_178 + sVar9);
              std::__cxx11::string::operator=
                        ((string *)&this->d->params[(int)local_19c].s,(string *)&local_198);
              if (local_198 != &local_188) {
                operator_delete(local_198,(long)local_188 + 1);
              }
            }
          }
          pPVar2 = this->d;
          lVar14 = (long)(int)local_19c;
          sVar3 = pPVar2->params[lVar14].s._M_string_length;
          if (pPVar2->params[lVar14].s._M_dataplus._M_p[sVar3 - 1] == '\"') {
            std::__cxx11::string::resize((ulong)&pPVar2->params[lVar14].s,(char)sVar3 + -1);
          }
          this->d->params[(int)local_19c].type = 7;
          bVar7 = false;
        }
        else {
          bVar7 = vstr_is_float(local_178);
          iVar8 = (*dr->_vptr_DataReader[2])(dr,"%1[,]",local_13c);
          if (iVar8 == 1) {
            local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (float *)0x0;
            local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (float *)0x0;
            local_188 = (int *)0x0;
            local_198 = (int **)0x0;
            iStack_190._M_current = (int *)0x0;
            if (bVar7) {
              fVar16 = vstr_to_float(local_178);
              local_160[0] = (long *)CONCAT44(local_160[0]._4_4_,fVar16);
              if (local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (local_138,
                           (iterator)
                           local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_160);
              }
              else {
                *local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = fVar16;
                local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              local_160[0] = (long *)((ulong)local_160[0] & 0xffffffff00000000);
              iVar8 = __isoc99_sscanf(local_178,"%d",(string *)local_160);
              if (iVar8 == 1) {
                if (iStack_190._M_current == local_188) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_198,iStack_190,
                             (int *)local_160);
                }
                else {
                  *iStack_190._M_current = (int)local_160[0];
                  iStack_190._M_current = iStack_190._M_current + 1;
                }
              }
              else {
                load_param();
              }
              if (iVar8 != 1) {
LAB_00141636:
                if (local_198 != (int **)0x0) {
                  operator_delete(local_198,(long)local_188 - (long)local_198);
                }
                if (local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_138[0].super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_138[0].
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_138[0].
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                goto LAB_0014166c;
              }
            }
            do {
              iVar8 = (*dr->_vptr_DataReader[2])(dr,"%15[^,\n ]",local_178);
              if (iVar8 != 1) break;
              if (bVar7) {
                fVar16 = vstr_to_float(local_178);
                local_160[0] = (long *)CONCAT44(local_160[0]._4_4_,fVar16);
                if (local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (local_138,
                             (iterator)
                             local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_160);
                }
                else {
                  *local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = fVar16;
                  local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              else {
                local_160[0] = (long *)((ulong)local_160[0] & 0xffffffff00000000);
                iVar8 = __isoc99_sscanf(local_178,"%d",(string *)local_160);
                if (iVar8 == 1) {
                  if (iStack_190._M_current == local_188) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_198,iStack_190,
                               (int *)local_160);
                  }
                  else {
                    *iStack_190._M_current = (int)local_160[0];
                    iStack_190._M_current = iStack_190._M_current + 1;
                  }
                }
                else {
                  load_param();
                }
                if (iVar8 != 1) goto LAB_00141636;
              }
              iVar8 = (*dr->_vptr_DataReader[2])(dr,"%1[,]",local_13c);
            } while (iVar8 == 1);
            if (bVar7) {
              Mat::create(&this->d->params[(int)local_19c].v,
                          (int)((ulong)((long)local_138[0].
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_138[0].
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 2),4,
                          (Allocator *)0x0);
              memcpy(this->d->params[(int)local_19c].v.data,
                     local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start);
              iVar8 = 6;
            }
            else {
              Mat::create(&this->d->params[(int)local_19c].v,
                          (int)((ulong)((long)iStack_190._M_current - (long)local_198) >> 2),4,
                          (Allocator *)0x0);
              memcpy(this->d->params[(int)local_19c].v.data,local_198,
                     (long)iStack_190._M_current - (long)local_198);
              iVar8 = 5;
            }
            this->d->params[(int)local_19c].type = iVar8;
            if (local_198 != (int **)0x0) {
              operator_delete(local_198,(long)local_188 - (long)local_198);
            }
            if (local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            if (bVar7) {
              fVar16 = vstr_to_float(local_178);
              this->d->params[(int)local_19c].field_1.f = fVar16;
              iVar12 = 3;
            }
            else {
              iVar8 = __isoc99_sscanf(local_178,"%d",&this->d->params[(int)local_19c].field_1);
              iVar12 = 2;
              if (iVar8 != 1) {
                load_param();
                goto LAB_0014166c;
              }
            }
            this->d->params[(int)local_19c].type = iVar12;
          }
          bVar7 = false;
        }
      }
    }
    else {
      load_param((ParamDict *)(ulong)(uint)local_19c);
LAB_0014166c:
      bVar7 = true;
    }
    if (bVar7) {
      return -1;
    }
    iVar8 = (*dr->_vptr_DataReader[2])(dr,"%d=",local_19c);
    auVar4 = local_19c;
  } while( true );
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    // 0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0
    // 3=0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            // old style array
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }

            continue;
        }

        char vstr[16];
        char comma[4];
        int nscan = dr.scan("%15[^,\n ]", vstr);
        if (nscan != 1)
        {
            NCNN_LOGE("ParamDict read value failed");
            return -1;
        }

        bool is_string = vstr_is_string(vstr);
        if (is_string)
        {
            // scan the remaining string
            char vstr2[256];
            vstr2[241] = '\0'; // max 255 = 15 + 240
            if (vstr[0] == '\"')
            {
                nscan = dr.scan("%255[^\"\n]\"", vstr2);
            }
            else
            {
                nscan = dr.scan("%255[^\n ]", vstr2);
            }
            if (nscan == 1)
            {
                if (vstr2[241] != '\0')
                {
                    NCNN_LOGE("string too long (id=%d)", id);
                    return -1;
                }

                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]) + vstr2;
                else
                    d->params[id].s = std::string(vstr) + vstr2;
            }
            else
            {
                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]);
                else
                    d->params[id].s = std::string(vstr);
            }

            if (d->params[id].s[d->params[id].s.size() - 1] == '\"')
                d->params[id].s.resize(d->params[id].s.size() - 1);

            d->params[id].type = 7;

            continue;
        }

        bool is_float = vstr_is_float(vstr);

        nscan = dr.scan("%1[,]", comma);
        is_array = nscan == 1;

        if (is_array)
        {
            std::vector<float> af;
            std::vector<int> ai;

            if (is_float)
            {
                af.push_back(vstr_to_float(vstr));
            }
            else
            {
                int v = 0;
                nscan = sscanf(vstr, "%d", &v);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }

                ai.push_back(v);
            }

            while (1)
            {
                nscan = dr.scan("%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    break;
                }

                if (is_float)
                {
                    af.push_back(vstr_to_float(vstr));
                }
                else
                {
                    int v = 0;
                    nscan = sscanf(vstr, "%d", &v);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse value failed");
                        return -1;
                    }

                    ai.push_back(v);
                }

                nscan = dr.scan("%1[,]", comma);
                if (nscan != 1)
                {
                    break;
                }
            }

            if (is_float)
            {
                d->params[id].v.create((int)af.size());
                memcpy(d->params[id].v.data, af.data(), af.size() * 4);
            }
            else
            {
                d->params[id].v.create((int)ai.size());
                memcpy(d->params[id].v.data, ai.data(), ai.size() * 4);
            }

            d->params[id].type = is_float ? 6 : 5;
        }
        else
        {
            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}